

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_scaling.c
# Opt level: O0

cupdlp_retcode
PDHG_Scale_Data(cupdlp_int log_level,CUPDLPcsc *csc,cupdlp_int ifScaling,CUPDLPscaling *scaling,
               cupdlp_float *cost,cupdlp_float *lower,cupdlp_float *upper,cupdlp_float *rhs)

{
  cupdlp_retcode cVar1;
  undefined4 *in_RCX;
  int in_EDX;
  int in_EDI;
  cupdlp_retcode retcode;
  cupdlp_float *unaff_retaddr;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000030;
  cupdlp_float *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  
  if (in_EDX != 0) {
    if (in_EDI != 0) {
      printf("--------------------------------------------------\n");
    }
    if (in_EDI != 0) {
      printf("running scaling\n");
    }
    if (in_RCX[6] != 0) {
      if (in_EDI != 0) {
        printf("- use Ruiz scaling\n");
      }
      cVar1 = cupdlp_ruiz_scaling((CUPDLPcsc *)upper,in_stack_00000038,
                                  (cupdlp_float *)CONCAT44(log_level,in_stack_00000030),
                                  (cupdlp_float *)csc,
                                  (cupdlp_float *)CONCAT44(ifScaling,in_stack_00000020),scaling);
      if (cVar1 != 0) {
        return 1;
      }
      *in_RCX = 1;
    }
    if (in_RCX[7] != 0) {
      if (in_EDI != 0) {
        printf("- use L2 scaling\n");
      }
      cVar1 = cupdlp_l2norm_scaling
                        ((CUPDLPcsc *)CONCAT44(ifScaling,in_stack_00000020),(cupdlp_float *)scaling,
                         cost,lower,unaff_retaddr,
                         (CUPDLPscaling *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
      if (cVar1 != 0) {
        return 1;
      }
      *in_RCX = 1;
    }
    if (in_RCX[8] != 0) {
      if (in_EDI != 0) {
        printf("- use PC scaling\n");
      }
      cVar1 = cupdlp_pc_scaling((CUPDLPcsc *)upper,in_stack_00000038,
                                (cupdlp_float *)CONCAT44(log_level,in_stack_00000030),
                                (cupdlp_float *)csc,
                                (cupdlp_float *)CONCAT44(ifScaling,in_stack_00000020),scaling);
      if (cVar1 != 0) {
        return 1;
      }
      *in_RCX = 1;
    }
    if (in_EDI != 0) {
      printf("--------------------------------------------------\n");
    }
  }
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Scale_Data(cupdlp_int log_level, CUPDLPcsc *csc,
                               cupdlp_int ifScaling, CUPDLPscaling *scaling,
                               cupdlp_float *cost, cupdlp_float *lower,
                               cupdlp_float *upper, cupdlp_float *rhs) {
  cupdlp_retcode retcode = RETCODE_OK;
  // scaling->dObjScale = 1.0;

#if CUPDLP_DEBUG
  //------------------- for debug ------------------
  cupdlp_float dMinElem = OUR_DBL_MAX;
  cupdlp_float dMaxElem = 0.0;
  cupdlp_float dAvgElem = 0.0;
  cupdlp_int nRows = csc->nRows;
  cupdlp_int nCols = csc->nCols;

  for (cupdlp_int iMatElem = csc->colMatBeg[0];
       iMatElem < csc->colMatBeg[nCols]; iMatElem++) {
    cupdlp_float dAbsElem = fabs(csc->colMatElem[iMatElem]);
    if (dAbsElem != 0.0) {
      dMaxElem = fmax(dMaxElem, dAbsElem);
      dMinElem = fmin(dMinElem, dAbsElem);
    }
    dAvgElem += dAbsElem;
  }
  dAvgElem /= csc->colMatBeg[nCols];

  if (log_level) {
    cupdlp_printf("Problem before rescaling:\n");
    cupdlp_printf(
        "Absolute value of nonzero constraint matrix elements: largest=%f, "
        "smallest=%f, avg=%f\n",
        dMaxElem, dMinElem, dAvgElem);
  }

  // calculate the three statistics of objective vector
  dMinElem = OUR_DBL_MAX;
  dMaxElem = 0.0;
  dAvgElem = 0.0;
  for (cupdlp_int iCol = 0; iCol < nCols; iCol++) {
    cupdlp_float dAbsElem = fabs(cost[iCol]);
    if (dAbsElem != 0.0) {
      dMaxElem = fmax(dMaxElem, dAbsElem);
      dMinElem = fmin(dMinElem, dAbsElem);
    }
    dAvgElem += dAbsElem;
  }
  dAvgElem /= nCols;

  // if (log_level) {}
  cupdlp_printf(
      "Absolute value of objective vector elements: largest=%f, smallest=%f, "
      "avg=%f\n",
      dMaxElem, dMinElem, dAvgElem);
  // calculate the three statistics of rhs vector
  dMinElem = OUR_DBL_MAX;
  dMaxElem = 0.0;
  dAvgElem = 0.0;
  for (cupdlp_int iRow = 0; iRow < nRows; iRow++) {
    cupdlp_float dAbsElem = fabs(rhs[iRow]);
    if (dAbsElem != 0.0) {
      dMaxElem = fmax(dMaxElem, dAbsElem);
      dMinElem = fmin(dMinElem, dAbsElem);
    }
    dAvgElem += dAbsElem;
  }
  dAvgElem /= nRows;
  cupdlp_printf(
      "Absolute value of rhs vector elements: largest=%f, smallest=%f, "
      "avg=%f\n",
      dMaxElem, dMinElem, dAvgElem);
//------------------- for debug ------------------
#endif

  if (ifScaling) {
    if (log_level) cupdlp_printf("--------------------------------------------------\n");
    if (log_level) cupdlp_printf("running scaling\n");

    if (scaling->ifRuizScaling) {
      if (log_level) cupdlp_printf("- use Ruiz scaling\n");
      CUPDLP_CALL(cupdlp_ruiz_scaling(csc, cost, lower, upper, rhs, scaling))
      scaling->ifScaled = 1;
    }
    if (scaling->ifL2Scaling) {
      if (log_level) cupdlp_printf("- use L2 scaling\n");
      CUPDLP_CALL(cupdlp_l2norm_scaling(csc, cost, lower, upper, rhs, scaling))
      scaling->ifScaled = 1;
    }
    if (scaling->ifPcScaling) {
      if (log_level) cupdlp_printf("- use PC scaling\n");
      CUPDLP_CALL(cupdlp_pc_scaling(csc, cost, lower, upper, rhs, scaling))
      scaling->ifScaled = 1;
    }

    if (log_level) cupdlp_printf("--------------------------------------------------\n");
  }

  /* make sure the csr matrix is also scaled*/
  // csc2csr(data->csr_matrix, csc);
#if CUPDLP_DEBUG
  //------------------- for debug ------------------
  dMinElem = OUR_DBL_MAX;
  dMaxElem = 0.0;
  dAvgElem = 0.0;
  for (cupdlp_int iMatElem = csc->colMatBeg[0];
       iMatElem < csc->colMatBeg[nCols]; iMatElem++) {
    cupdlp_float dAbsElem = fabs(csc->colMatElem[iMatElem]);
    if (dAbsElem != 0.0) {
      dMaxElem = fmax(dMaxElem, dAbsElem);
      dMinElem = fmin(dMinElem, dAbsElem);
    }
    dAvgElem += dAbsElem;
  }
  dAvgElem /= csc->colMatBeg[nCols];

  if (log_level) cupdlp_printf("Problem after rescaling:\n");
  if (log_level) cupdlp_printf(
      "Absolute value of nonzero constraint matrix elements: largest=%f, "
      "smallest=%f, avg=%f\n",
      dMaxElem, dMinElem, dAvgElem);

  // calculate the three statistics of objective vector
  dMinElem = OUR_DBL_MAX;
  dMaxElem = 0.0;
  dAvgElem = 0.0;
  for (cupdlp_int iCol = 0; iCol < nCols; iCol++) {
    cupdlp_float dAbsElem = fabs(cost[iCol]);
    if (dAbsElem != 0.0) {
      dMaxElem = fmax(dMaxElem, dAbsElem);
      dMinElem = fmin(dMinElem, dAbsElem);
    }
    dAvgElem += dAbsElem;
  }
  dAvgElem /= nCols;
  if (log_level) cupdlp_printf(
      "Absolute value of objective vector elements: largest=%f, smallest=%f, "
      "avg=%f\n",
      dMaxElem, dMinElem, dAvgElem);
  // calculate the three statistics of rhs vector
  dMinElem = OUR_DBL_MAX;
  dMaxElem = 0.0;
  dAvgElem = 0.0;
  for (cupdlp_int iRow = 0; iRow < nRows; iRow++) {
    cupdlp_float dAbsElem = fabs(rhs[iRow]);
    if (dAbsElem != 0.0) {
      dMaxElem = fmax(dMaxElem, dAbsElem);
      dMinElem = fmin(dMinElem, dAbsElem);
    }
    dAvgElem += dAbsElem;
  }
  dAvgElem /= nRows;
  if (log_level) cupdlp_printf(
      "Absolute value of rhs vector elements: largest=%f, smallest=%f, "
      "avg=%f\n",
      dMaxElem, dMinElem, dAvgElem);
//------------------- for debug ------------------
#endif

exit_cleanup:

  return retcode;
}